

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O1

void __thiscall
World_3df::perform_selection
          (World_3df *this,shared_ptr<Population> *src,shared_ptr<Population> *dst,SEL_TYPE sel)

{
  runtime_error *this_00;
  
  if (sel == S_TOURNAMENT) {
    (*(this->super_World)._vptr_World[9])();
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unknown selection type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void World_3df::perform_selection( boost::shared_ptr<Population>& src, boost::shared_ptr<Population>& dst, SEL_TYPE sel )
{

	//save_elite(src, dst);

	switch(sel)
	{
		case S_TOURNAMENT:
			tournament_selection(src, dst);
			break;
		default:
			throw std::runtime_error("Unknown selection type");
			break;
	}

}